

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_prepare.cpp
# Opt level: O1

void __thiscall mocker::CodegenPreparation::sortBlocks(CodegenPreparation *this)

{
  __node_base_ptr *pp_Var1;
  FunctionModule *pFVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  undefined8 uVar6;
  BasicBlock *pBVar7;
  mapped_type *pmVar8;
  BasicBlock *pBVar9;
  _List_node_base *p_Var10;
  __node_base_ptr p_Var11;
  _Node *p_Var12;
  __hash_code __code;
  BasicBlockList *pBVar13;
  ulong uVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  size_t __bkt;
  _List_node_base *p_Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Hash_node_base *p_Var16;
  __node_base_ptr p_Var17;
  iterator __end1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ulong *puVar18;
  iterator __begin1;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_02;
  undefined8 uVar19;
  bool bVar20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> order;
  BasicBlockList newBBs;
  unsigned_long n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> PreOrder;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  visited;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> local_b8;
  _List_node_base *local_a0;
  ulong *local_98;
  ulong *puStack_90;
  long local_88;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_78;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_70;
  ulong *local_38;
  
  local_78 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->loopTree;
  LoopInfo::init((LoopInfo *)local_78,(EVP_PKEY_CTX *)(this->super_FuncPass).func);
  pFVar2 = (this->super_FuncPass).func;
  local_98 = (ulong *)0x0;
  puStack_90 = (ulong *)0x0;
  local_88 = 0;
  pp_Var1 = &local_70._M_single_bucket;
  local_70._M_bucket_count = 1;
  local_70._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70._M_element_count = 0;
  local_70._M_rehash_policy._M_max_load_factor = 1.0;
  local_70._M_rehash_policy._M_next_resize = 0;
  local_70._M_single_bucket = (__node_base_ptr)0x0;
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_70._M_buckets = pp_Var1;
  local_d8._M_unused._M_object = operator_new(0x20);
  *(ulong ***)local_d8._M_unused._0_8_ = &local_98;
  *(FunctionModule **)((long)local_d8._M_unused._0_8_ + 8) = pFVar2;
  *(_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    **)((long)local_d8._M_unused._0_8_ + 0x10) = &local_70;
  *(_Any_data **)((long)local_d8._M_unused._0_8_ + 0x18) = &local_d8;
  pcStack_c0 = std::
               _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/codegen_prepare.cpp:25:42)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/codegen_prepare.cpp:25:42)>
             ::_M_manager;
  local_b8._M_impl._M_node.super__List_node_base._M_next =
       (pFVar2->bbs).
       super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
       _M_node.super__List_node_base._M_next[1]._M_next;
  std::
  _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/codegen_prepare.cpp:25:42)>
  ::_M_invoke(&local_d8,(unsigned_long *)&local_b8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,3);
  }
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_70);
  local_70._M_bucket_count = 1;
  local_70._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70._M_element_count = 0;
  local_70._M_rehash_policy._M_max_load_factor = 1.0;
  local_70._M_rehash_policy._M_next_resize = 0;
  local_70._M_single_bucket = (__node_base_ptr)0x0;
  local_d8._M_unused._M_object = (unsigned_long *)0x0;
  local_d8._8_8_ = (_func_void *)0x0;
  local_c8 = (code *)0x0;
  local_38 = puStack_90;
  puVar18 = local_98;
  this_02 = local_78;
  local_70._M_buckets = pp_Var1;
  if (local_98 != puStack_90) {
    do {
      local_a0 = (_List_node_base *)*puVar18;
      uVar14 = (ulong)local_a0 % local_70._M_bucket_count;
      p_Var3 = local_70._M_buckets[uVar14];
      p_Var11 = (__node_base_ptr)0x0;
      if ((p_Var3 != (__node_base_ptr)0x0) &&
         (p_Var11 = p_Var3, p_Var17 = p_Var3->_M_nxt,
         local_a0 != (_List_node_base *)p_Var3->_M_nxt[1]._M_nxt)) {
        while (p_Var4 = p_Var17->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
          p_Var11 = (__node_base_ptr)0x0;
          if (((ulong)p_Var4[1]._M_nxt % local_70._M_bucket_count != uVar14) ||
             (p_Var11 = p_Var17, p_Var17 = p_Var4, local_a0 == (_List_node_base *)p_Var4[1]._M_nxt))
          goto LAB_0015ba43;
        }
        p_Var11 = (__node_base_ptr)0x0;
      }
LAB_0015ba43:
      if (((p_Var11 == (__node_base_ptr)0x0) || (p_Var11->_M_nxt == (_Hash_node_base *)0x0)) ||
         (*(_List_node_base **)(local_d8._8_8_ + -8) == local_a0)) {
        if (p_Var3 == (__node_base_ptr)0x0) {
LAB_0015ba97:
          p_Var16 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var15 = (_List_node_base *)p_Var3->_M_nxt[1]._M_nxt;
          p_Var4 = p_Var3->_M_nxt;
          do {
            p_Var16 = p_Var3;
            if (local_a0 == p_Var15) break;
            p_Var5 = p_Var4->_M_nxt;
            if (p_Var5 == (_Hash_node_base *)0x0) goto LAB_0015ba97;
            p_Var15 = (_List_node_base *)p_Var5[1]._M_nxt;
            p_Var16 = (_Hash_node_base *)0x0;
            p_Var3 = p_Var4;
            p_Var4 = p_Var5;
          } while ((ulong)p_Var15 % local_70._M_bucket_count == uVar14);
        }
        if ((p_Var16 == (_Hash_node_base *)0x0) || (p_Var16->_M_nxt == (_Hash_node_base *)0x0)) {
          if ((code *)local_d8._8_8_ == local_c8) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_d8._M_pod_data,
                       (iterator)local_d8._8_8_,(unsigned_long *)&local_a0);
          }
          else {
            *(_List_node_base **)local_d8._8_8_ = local_a0;
            local_d8._8_8_ = local_d8._8_8_ + 8;
          }
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<unsigned_long&>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_70,&local_a0);
        }
        pBVar7 = ir::FunctionModule::getBasicBlock((this->super_FuncPass).func,(size_t)local_a0);
        p_Var15 = (pBVar7->insts).
                  super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev;
        p_Var10 = p_Var15[1]._M_next;
        if (*(int *)&p_Var10->_M_prev == 0xb) {
          this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var15[1]._M_prev;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
        }
        else {
          this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var10 = (_List_node_base *)0x0;
        }
        if (p_Var10 != (_List_node_base *)0x0) {
          local_b8._M_impl._M_node.super__List_node_base._M_next = local_a0;
          pmVar8 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at(this_02,(key_type *)&local_b8);
          if ((pmVar8->_M_h)._M_element_count == 1) {
            pBVar7 = ir::FunctionModule::getBasicBlock
                               ((this->super_FuncPass).func,(size_t)(p_Var10[2]._M_prev)->_M_prev);
            pBVar9 = ir::FunctionModule::getBasicBlock
                               ((this->super_FuncPass).func,(size_t)(p_Var10[3]._M_prev)->_M_prev);
            p_Var15 = (pBVar7->insts).
                      super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                      ._M_impl._M_node.super__List_node_base._M_prev;
            p_Var10 = p_Var15[1]._M_next;
            if (*(int *)&p_Var10->_M_prev == 0xd) {
              this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var15[1]._M_prev;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                }
              }
            }
            else {
              this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var10 = (_List_node_base *)0x0;
            }
            if (p_Var10 == (_List_node_base *)0x0) {
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
            }
            else {
              p_Var4 = (_Hash_node_base *)pBVar9->labelID;
              p_Var3 = local_70._M_buckets[(ulong)p_Var4 % local_70._M_bucket_count];
              p_Var11 = (__node_base_ptr)0x0;
              if ((p_Var3 != (__node_base_ptr)0x0) &&
                 (p_Var11 = p_Var3, p_Var17 = p_Var3->_M_nxt, p_Var4 != p_Var3->_M_nxt[1]._M_nxt)) {
                while (p_Var16 = p_Var17->_M_nxt, p_Var16 != (_Hash_node_base *)0x0) {
                  p_Var11 = (__node_base_ptr)0x0;
                  if (((ulong)p_Var16[1]._M_nxt % local_70._M_bucket_count !=
                       (ulong)p_Var4 % local_70._M_bucket_count) ||
                     (p_Var11 = p_Var17, p_Var17 = p_Var16, p_Var4 == p_Var16[1]._M_nxt))
                  goto LAB_0015bc72;
                }
                p_Var11 = (__node_base_ptr)0x0;
              }
LAB_0015bc72:
              if (p_Var11 == (__node_base_ptr)0x0) {
                bVar20 = false;
              }
              else {
                bVar20 = p_Var11->_M_nxt != (_Hash_node_base *)0x0;
              }
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
              this_02 = local_78;
              if (!bVar20) {
                local_b8._M_impl._M_node.super__List_node_base._M_next =
                     (_List_node_base *)pBVar9->labelID;
                if ((code *)local_d8._8_8_ == local_c8) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<unsigned_long>
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,
                             (iterator)local_d8._8_8_,(unsigned_long *)&local_b8);
                }
                else {
                  *(_List_node_base **)local_d8._8_8_ =
                       local_b8._M_impl._M_node.super__List_node_base._M_next;
                  local_d8._8_8_ = local_d8._8_8_ + 8;
                }
                local_b8._M_impl._M_node.super__List_node_base._M_next =
                     (_List_node_base *)pBVar9->labelID;
                std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::_M_emplace<unsigned_long>(&local_70,&local_b8);
                goto LAB_0015bda1;
              }
            }
            p_Var15 = (_List_node_base *)pBVar7->labelID;
            p_Var3 = local_70._M_buckets[(ulong)p_Var15 % local_70._M_bucket_count];
            p_Var11 = (__node_base_ptr)0x0;
            if ((p_Var3 != (__node_base_ptr)0x0) &&
               (p_Var11 = p_Var3, p_Var17 = p_Var3->_M_nxt,
               p_Var15 != (_List_node_base *)p_Var3->_M_nxt[1]._M_nxt)) {
              while (p_Var4 = p_Var17->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
                p_Var11 = (__node_base_ptr)0x0;
                if (((ulong)p_Var4[1]._M_nxt % local_70._M_bucket_count !=
                     (ulong)p_Var15 % local_70._M_bucket_count) ||
                   (p_Var11 = p_Var17, p_Var17 = p_Var4,
                   p_Var15 == (_List_node_base *)p_Var4[1]._M_nxt)) goto LAB_0015bd4c;
              }
              p_Var11 = (__node_base_ptr)0x0;
            }
LAB_0015bd4c:
            if ((p_Var11 == (__node_base_ptr)0x0) || (p_Var11->_M_nxt == (_Hash_node_base *)0x0)) {
              if ((code *)local_d8._8_8_ == local_c8) {
                local_b8._M_impl._M_node.super__List_node_base._M_next = p_Var15;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                _M_realloc_insert<unsigned_long>
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,
                           (iterator)local_d8._8_8_,(unsigned_long *)&local_b8);
              }
              else {
                *(_List_node_base **)local_d8._8_8_ = p_Var15;
                local_d8._8_8_ = local_d8._8_8_ + 8;
              }
              local_b8._M_impl._M_node.super__List_node_base._M_next =
                   (_List_node_base *)pBVar7->labelID;
              std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_emplace<unsigned_long>(&local_70,&local_b8);
            }
          }
          else {
            local_b8._M_impl._M_node.super__List_node_base._M_next = (p_Var10[2]._M_prev)->_M_prev;
            if ((code *)local_d8._8_8_ == local_c8) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_d8._M_pod_data
                         ,(iterator)local_d8._8_8_,(unsigned_long *)&local_b8);
            }
            else {
              *(_List_node_base **)local_d8._8_8_ =
                   local_b8._M_impl._M_node.super__List_node_base._M_next;
              local_d8._8_8_ = local_d8._8_8_ + 8;
            }
            std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::_M_emplace<unsigned_long&>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&local_70,&local_b8);
          }
        }
LAB_0015bda1:
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
      }
      puVar18 = puVar18 + 1;
    } while (puVar18 != local_38);
  }
  uVar6 = local_d8._8_8_;
  if (local_d8._8_8_ - local_d8._0_8_ != (long)puStack_90 - (long)local_98) {
    __assert_fail("order.size() == PreOrder.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/codegen_prepare.cpp"
                  ,0x5e,"void mocker::CodegenPreparation::sortBlocks()");
  }
  local_b8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b8;
  local_b8._M_impl._M_node._M_size = 0;
  local_b8._M_impl._M_node.super__List_node_base._M_prev =
       local_b8._M_impl._M_node.super__List_node_base._M_next;
  if (local_d8._M_unused._M_object != (void *)local_d8._8_8_) {
    uVar19 = local_d8._M_unused._0_8_;
    do {
      pBVar13 = &((this->super_FuncPass).func)->bbs;
      p_Var15 = (_List_node_base *)pBVar13;
      do {
        p_Var15 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                   &p_Var15->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var15 == (_List_node_base *)pBVar13) goto LAB_0015be3c;
      } while (p_Var15[1]._M_next != (_List_node_base *)*(unsigned_long *)uVar19);
      p_Var12 = std::__cxx11::list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>>::
                _M_create_node<mocker::ir::BasicBlock_const&>
                          ((list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *)
                           &local_b8,(BasicBlock *)(p_Var15 + 1));
      std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
      local_b8._M_impl._M_node._M_size = local_b8._M_impl._M_node._M_size + 1;
LAB_0015be3c:
      uVar19 = uVar19 + 8;
    } while (uVar19 != uVar6);
  }
  std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
  _M_move_assign(&((this->super_FuncPass).func)->bbs,&local_b8);
  std::__cxx11::_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
  _M_clear(&local_b8);
  if ((_func_void *)local_d8._M_unused._0_8_ != (_func_void *)0x0) {
    operator_delete(local_d8._M_unused._M_object,(long)local_c8 - local_d8._0_8_);
  }
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_70);
  if (local_98 != (ulong *)0x0) {
    operator_delete(local_98,local_88 - (long)local_98);
  }
  return;
}

Assistant:

void CodegenPreparation::sortBlocks() {
  loopTree.init(func);

  const auto PreOrder = getPreOrder(func);

  std::unordered_set<std::size_t> visited;
  std::vector<std::size_t> order;
  for (auto n : PreOrder) {
    if (isIn(visited, n) && order.back() != n) // can not be scheduled
      continue;

    if (!isIn(visited, n)) {
      order.emplace_back(n);
      visited.emplace(n);
    }

    auto br = ir::dyc<ir::Branch>(func.getBasicBlock(n).getInsts().back());
    if (!br) {
      continue;
    }

    if (loopTree.isLoopHeader(n)) {
      auto nxt = br->getThen()->getID();
      order.emplace_back(nxt);
      visited.emplace(nxt);
      continue;
    }

    auto &thenBB = func.getBasicBlock(br->getThen()->getID());
    auto &elseBB = func.getBasicBlock(br->getElse()->getID());
    if (ir::dyc<ir::Ret>(thenBB.getInsts().back()) &&
        !isIn(visited, elseBB.getLabelID())) {
      order.emplace_back(elseBB.getLabelID());
      visited.emplace(elseBB.getLabelID());
    } else if (!isIn(visited, thenBB.getLabelID())) {
      order.emplace_back(thenBB.getLabelID());
      visited.emplace(thenBB.getLabelID());
    }
  }

  assert(order.size() == PreOrder.size());

  ir::BasicBlockList newBBs;
  for (auto cur : order) {
    for (auto &bb : func.getBBs()) {
      if (bb.getLabelID() != cur)
        continue;
      newBBs.emplace_back(bb);
      break;
    }
  }
  func.getMutableBBs() = std::move(newBBs);
}